

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedAllocator.cpp
# Opt level: O0

void * btAlignedAllocDefault(size_t size,int alignment)

{
  void *pvVar1;
  int in_ESI;
  long in_RDI;
  char *real;
  void *ret;
  char *local_18;
  
  pvVar1 = (*sAllocFunc)(in_RDI + 8 + (long)(in_ESI + -1));
  if (pvVar1 == (void *)0x0) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = btAlignPointer<char>((char *)((long)pvVar1 + 8),(long)in_ESI);
    *(void **)(local_18 + -8) = pvVar1;
  }
  return local_18;
}

Assistant:

static inline void *btAlignedAllocDefault(size_t size, int alignment)
{
  void *ret;
  char *real;
  real = (char *)sAllocFunc(size + sizeof(void *) + (alignment-1));
  if (real) {
	ret = btAlignPointer(real + sizeof(void *),alignment);
    *((void **)(ret)-1) = (void *)(real);
  } else {
    ret = (void *)(real);
  }
  return (ret);
}